

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::class_<pybind11::module_local>
          (class_<CoreML::MilStoragePython::MilStoragePythonWriter> *this,handle scope,char *name,
          module_local *extra)

{
  undefined1 local_b0 [8];
  type_record record;
  module_local *extra_local;
  char *name_local;
  class_<CoreML::MilStoragePython::MilStoragePythonWriter> *this_local;
  handle scope_local;
  
  record._128_8_ = extra;
  detail::generic_type::generic_type(&this->super_generic_type);
  detail::type_record::type_record((type_record *)local_b0);
  record.name = (char *)&CoreML::MilStoragePython::MilStoragePythonWriter::typeinfo;
  record.type = (type_info *)0x8;
  record.type_size = 8;
  record.type_align = 8;
  record.operator_new = init_instance;
  record.init_instance = dealloc;
  record.custom_type_setup_callback._M_invoker._0_1_ =
       (byte)record.custom_type_setup_callback._M_invoker | 8;
  local_b0 = (undefined1  [8])scope.m_ptr;
  record.scope.m_ptr = (PyObject *)name;
  detail::set_operator_new<CoreML::MilStoragePython::MilStoragePythonWriter>(local_b0);
  detail::process_attributes<pybind11::module_local>::init
            ((process_attributes<pybind11::module_local> *)record._128_8_,(EVP_PKEY_CTX *)local_b0);
  detail::generic_type::initialize(&this->super_generic_type,(type_record *)local_b0);
  detail::type_record::~type_record((type_record *)local_b0);
  return;
}

Assistant:

class_(handle scope, const char *name, const Extra &...extra) {
        using namespace detail;

        // MI can only be specified via class_ template options, not constructor parameters
        static_assert(
            none_of<is_pyobject<Extra>...>::value || // no base class arguments, or:
                (constexpr_sum(is_pyobject<Extra>::value...) == 1 && // Exactly one base
                 constexpr_sum(is_base<options>::value...) == 0 &&   // no template option bases
                 // no multiple_inheritance attr
                 none_of<std::is_same<multiple_inheritance, Extra>...>::value),
            "Error: multiple inheritance bases must be specified via class_ template options");

        type_record record;
        record.scope = scope;
        record.name = name;
        record.type = &typeid(type);
        record.type_size = sizeof(conditional_t<has_alias, type_alias, type>);
        record.type_align = alignof(conditional_t<has_alias, type_alias, type> &);
        record.holder_size = sizeof(holder_type);
        record.init_instance = init_instance;
        record.dealloc = dealloc;
        record.default_holder = detail::is_instantiation<std::unique_ptr, holder_type>::value;

        set_operator_new<type>(&record);

        /* Register base classes specified via template arguments to class_, if any */
        PYBIND11_EXPAND_SIDE_EFFECTS(add_base<options>(record));

        /* Process optional arguments, if any */
        process_attributes<Extra...>::init(extra..., &record);

        generic_type::initialize(record);

        if (has_alias) {
            with_internals([&](internals &internals) {
                auto &instances = record.module_local ? get_local_internals().registered_types_cpp
                                                      : internals.registered_types_cpp;
                instances[std::type_index(typeid(type_alias))]
                    = instances[std::type_index(typeid(type))];
            });
        }
    }